

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

pair<const_void_*,_const_pybind11::detail::type_info_*>
pybind11::detail::type_caster_base<ki::dml::Field<signed_char>_>::src_and_type(itype *src)

{
  _func_int **pp_Var1;
  _func_int *p_Var2;
  bool bVar3;
  type_info *ptVar4;
  type_info *__arg;
  pair<const_void_*,_const_pybind11::detail::type_info_*> pVar5;
  type_index local_20;
  
  if (src != (itype *)0x0) {
    pp_Var1 = (src->super_FieldBase).super_Serializable._vptr_Serializable;
    __arg = (type_info *)pp_Var1[-1];
    if (__arg != (type_info *)0x0) {
      p_Var2 = pp_Var1[-2];
      bVar3 = std::type_info::operator==((type_info *)&ki::dml::Field<signed_char>::typeinfo,__arg);
      if (!bVar3) {
        local_20._M_target = __arg;
        ptVar4 = get_type_info(&local_20,false);
        pVar5.second = ptVar4;
        pVar5.first = p_Var2 + (long)&(src->super_FieldBase).super_Serializable._vptr_Serializable;
        if (ptVar4 != (type_info *)0x0) {
          return pVar5;
        }
      }
      goto LAB_00135d47;
    }
  }
  __arg = (type_info *)0x0;
LAB_00135d47:
  pVar5 = type_caster_generic::src_and_type
                    (src,(type_info *)&ki::dml::Field<signed_char>::typeinfo,__arg);
  return pVar5;
}

Assistant:

static std::pair<const void *, const type_info *> src_and_type(const itype *src) {
        auto &cast_type = typeid(itype);
        const std::type_info *instance_type = nullptr;
        const void *vsrc = polymorphic_type_hook<itype>::get(src, instance_type);
        if (instance_type && !same_type(cast_type, *instance_type)) {
            // This is a base pointer to a derived type. If the derived type is registered
            // with pybind11, we want to make the full derived object available.
            // In the typical case where itype is polymorphic, we get the correct
            // derived pointer (which may be != base pointer) by a dynamic_cast to
            // most derived type. If itype is not polymorphic, we won't get here
            // except via a user-provided specialization of polymorphic_type_hook,
            // and the user has promised that no this-pointer adjustment is
            // required in that case, so it's OK to use static_cast.
            if (const auto *tpi = get_type_info(*instance_type))
                return {vsrc, tpi};
        }
        // Otherwise we have either a nullptr, an `itype` pointer, or an unknown derived pointer, so
        // don't do a cast
        return type_caster_generic::src_and_type(src, cast_type, instance_type);
    }